

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O0

RefToken __thiscall antlr::CharScanner::makeToken(CharScanner *this,int t)

{
  Token *pTVar1;
  LexerInputState *pLVar2;
  uint in_EDX;
  long in_RSI;
  TokenRef *in_RDI;
  RefToken *tok;
  
  (**(code **)(in_RSI + 0x30))();
  pTVar1 = TokenRefCount<antlr::Token>::operator->((TokenRefCount<antlr::Token> *)in_RDI);
  (*pTVar1->_vptr_Token[10])(pTVar1,(ulong)in_EDX);
  pTVar1 = TokenRefCount<antlr::Token>::operator->((TokenRefCount<antlr::Token> *)in_RDI);
  pLVar2 = RefCount<antlr::LexerInputState>::operator->
                     ((RefCount<antlr::LexerInputState> *)(in_RSI + 0x78));
  (*pTVar1->_vptr_Token[7])(pTVar1,(ulong)(uint)pLVar2->tokenStartColumn);
  pTVar1 = TokenRefCount<antlr::Token>::operator->((TokenRefCount<antlr::Token> *)in_RDI);
  pLVar2 = RefCount<antlr::LexerInputState>::operator->
                     ((RefCount<antlr::LexerInputState> *)(in_RSI + 0x78));
  (*pTVar1->_vptr_Token[8])(pTVar1,(ulong)(uint)pLVar2->tokenStartLine);
  return (RefToken)in_RDI;
}

Assistant:

virtual RefToken makeToken(int t)
	{
		RefToken tok = tokenFactory();
		tok->setType(t);
		tok->setColumn(inputState->tokenStartColumn);
		tok->setLine(inputState->tokenStartLine);
		return tok;
	}